

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_compilation.cpp
# Opt level: O0

void __thiscall ExchangeCompilation_Empty_Test::TestBody(ExchangeCompilation_Empty_Test *this)

{
  bool bVar1;
  bool bVar2;
  uint generation;
  iterator first;
  iterator last;
  mapped_type *pmVar3;
  element_type *peVar4;
  string *psVar5;
  parser<pstore::exchange::import_ns::callbacks> *ppVar6;
  Message *pMVar7;
  error_code *peVar8;
  char *message;
  char *pcVar9;
  element_type *peVar10;
  typed_address<pstore::indirect_string> addr;
  database *pdVar11;
  insert_iterator<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::typed_address<pstore::indirect_string>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::typed_address<pstore::indirect_string>_>_>_>_>
  out;
  extent<pstore::repo::compilation> eVar12;
  AssertHelper local_830;
  Message local_828;
  uint local_820;
  size_type local_81c;
  undefined1 local_818 [8];
  AssertionResult gtest_ar_2;
  Message local_800;
  address local_7f8;
  string local_7f0;
  undefined1 local_7d0 [8];
  AssertionResult gtest_ar_1;
  shared_ptr<const_pstore::repo::compilation> imported_compilation;
  Message local_7a8;
  iterator local_7a0;
  undefined1 local_6b0 [8];
  AssertionResult gtest_ar;
  const_iterator pos;
  shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>_>
  compilation_index;
  AssertHelper local_580;
  char local_575;
  coord local_574;
  char local_569;
  string local_568;
  Message local_548;
  bool local_539;
  undefined1 local_538 [8];
  AssertionResult gtest_ar__1;
  parser<pstore::exchange::import_ns::callbacks> compilation_parser;
  shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>_>
  fragment_index;
  string local_468;
  AssertHelper local_448;
  char local_43d;
  coord local_43c;
  char local_431;
  string local_430;
  Message local_410;
  bool local_401;
  undefined1 local_400 [8];
  AssertionResult gtest_ar_;
  parser<pstore::exchange::import_ns::callbacks> name_parser;
  undefined1 local_338 [8];
  transaction<std::unique_lock<mock_mutex>_> transaction_1;
  undefined1 local_2f8 [7];
  mock_mutex mutex_1;
  string_mapping imported_names;
  digest compilation_digest;
  undefined1 local_260 [20];
  indent local_24c;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_248;
  __normal_iterator<pstore::repo::definition_*,_std::vector<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>_>
  local_240;
  allocator local_231;
  key_type local_230;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_210;
  address local_208;
  extent<pstore::repo::compilation> compilation;
  vector<pstore::repo::definition,_std::allocator<pstore::repo::definition>_> definitions;
  undefined1 local_1d0 [8];
  transaction<std::unique_lock<mock_mutex>_> transaction;
  undefined1 local_190 [7];
  mock_mutex mutex;
  ostringstream exported_compilation_stream;
  string local_138;
  indent local_114;
  undefined1 local_110 [8];
  ostringstream exported_names_stream;
  undefined1 local_b8 [8];
  string_mapping exported_names;
  undefined1 local_58 [8];
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::typed_address<pstore::indirect_string>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::typed_address<pstore::indirect_string>_>_>_>
  indir_strings;
  array<const_char_*,_1UL> names;
  char *triple;
  ExchangeCompilation_Empty_Test *this_local;
  
  names._M_elems[0] = (_Type)anon_var_dwarf_a465b;
  indir_strings._M_h._M_single_bucket = (__node_base_ptr)anon_var_dwarf_a465b;
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::typed_address<pstore::indirect_string>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::typed_address<pstore::indirect_string>_>_>_>
  ::unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::typed_address<pstore::indirect_string>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::typed_address<pstore::indirect_string>_>_>_>
                   *)local_58);
  first = std::begin<std::array<char_const*,1ul>>
                    ((array<const_char_*,_1UL> *)&indir_strings._M_h._M_single_bucket);
  last = std::end<std::array<char_const*,1ul>>
                   ((array<const_char_*,_1UL> *)&indir_strings._M_h._M_single_bucket);
  exported_names.strings_._M_h._M_single_bucket =
       (__node_base_ptr)
       std::
       end<std::unordered_map<std::__cxx11::string,pstore::typed_address<pstore::indirect_string>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,pstore::typed_address<pstore::indirect_string>>>>>
                 ((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::typed_address<pstore::indirect_string>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::typed_address<pstore::indirect_string>_>_>_>
                   *)local_58);
  out = std::
        inserter<std::unordered_map<std::__cxx11::string,pstore::typed_address<pstore::indirect_string>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,pstore::typed_address<pstore::indirect_string>>>>>
                  ((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::typed_address<pstore::indirect_string>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::typed_address<pstore::indirect_string>_>_>_>
                    *)local_58,(iterator)exported_names.strings_._M_h._M_single_bucket);
  add_export_strings<(pstore::trailer::indices)3,char_const**,std::insert_iterator<std::unordered_map<std::__cxx11::string,pstore::typed_address<pstore::indirect_string>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,pstore::typed_address<pstore::indirect_string>>>>>>
            (&(this->super_ExchangeCompilation).export_db_,first,last,out);
  pstore::exchange::export_ns::name_index_tag();
  pstore::exchange::export_ns::string_mapping::string_mapping<(pstore::trailer::indices)3>
            ((string_mapping *)local_b8,&(this->super_ExchangeCompilation).export_db_);
  pstore::exchange::export_ns::ostringstream::ostringstream((ostringstream *)local_110);
  local_114.distance_ = 0;
  pstore::exchange::export_ns::indent::indent(&local_114);
  pdVar11 = &(this->super_ExchangeCompilation).export_db_;
  generation = pstore::database::get_current_revision(pdVar11);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_138,"",
             (allocator *)(exported_compilation_stream.str_.field_2._M_local_buf + 0xf));
  pstore::exchange::export_ns::emit_strings<(pstore::trailer::indices)3>
            ((ostream_base *)local_110,local_114,pdVar11,generation,&local_138,
             (string_mapping *)local_b8,false);
  std::__cxx11::string::~string((string *)&local_138);
  std::allocator<char>::~allocator
            ((allocator<char> *)(exported_compilation_stream.str_.field_2._M_local_buf + 0xf));
  pstore::exchange::export_ns::ostringstream::ostringstream((ostringstream *)local_190);
  std::unique_lock<mock_mutex>::unique_lock
            ((unique_lock<mock_mutex> *)
             &definitions.
              super__Vector_base<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,
             (mutex_type *)&transaction.lock_.field_0xf);
  ::begin((transaction<std::unique_lock<mock_mutex>_> *)local_1d0,
          &(this->super_ExchangeCompilation).export_db_,
          (unique_lock<mock_mutex> *)
          &definitions.
           super__Vector_base<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::unique_lock<mock_mutex>::~unique_lock
            ((unique_lock<mock_mutex> *)
             &definitions.
              super__Vector_base<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>::vector
            ((vector<pstore::repo::definition,_std::allocator<pstore::repo::definition>_> *)
             &compilation.size);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_230,"triple",&local_231);
  pmVar3 = std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::typed_address<pstore::indirect_string>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::typed_address<pstore::indirect_string>_>_>_>
           ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::typed_address<pstore::indirect_string>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::typed_address<pstore::indirect_string>_>_>_>
                         *)local_58,&local_230);
  local_210._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(pmVar3->a_).a_;
  local_240._M_current =
       (definition *)
       std::begin<std::vector<pstore::repo::definition,std::allocator<pstore::repo::definition>>>
                 ((vector<pstore::repo::definition,_std::allocator<pstore::repo::definition>_> *)
                  &compilation.size);
  local_248._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       std::end<std::vector<pstore::repo::definition,std::allocator<pstore::repo::definition>>>
                 ((vector<pstore::repo::definition,_std::allocator<pstore::repo::definition>_> *)
                  &compilation.size);
  eVar12 = pstore::repo::compilation::
           alloc<pstore::transaction<std::unique_lock<mock_mutex>>,__gnu_cxx::__normal_iterator<pstore::repo::definition*,std::vector<pstore::repo::definition,std::allocator<pstore::repo::definition>>>>
                     ((transaction<std::unique_lock<mock_mutex>_> *)local_1d0,
                      (typed_address<pstore::indirect_string>)local_210._M_pi,local_240,
                      (__normal_iterator<pstore::repo::definition_*,_std::vector<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>_>
                       )local_248._M_pi);
  compilation.addr.a_.a_ = (address)eVar12.size;
  local_208.a_ = (value_type)eVar12.addr.a_.a_;
  std::__cxx11::string::~string((string *)&local_230);
  std::allocator<char>::~allocator((allocator<char> *)&local_231);
  local_24c.distance_ = 0;
  pstore::exchange::export_ns::indent::indent(&local_24c);
  pdVar11 = &(this->super_ExchangeCompilation).export_db_;
  pstore::database::getro<pstore::repo::compilation,void>
            ((database *)local_260,(extent<pstore::repo::compilation> *)pdVar11);
  peVar4 = std::
           __shared_ptr_access<const_pstore::repo::compilation,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator*((__shared_ptr_access<const_pstore::repo::compilation,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)local_260);
  pcVar9 = (char *)0x0;
  pstore::exchange::export_ns::emit_compilation
            ((ostream_base *)local_190,local_24c,pdVar11,peVar4,(string_mapping *)local_b8,false);
  std::shared_ptr<const_pstore::repo::compilation>::~shared_ptr
            ((shared_ptr<const_pstore::repo::compilation> *)local_260);
  pstore::transaction_base::commit((transaction_base *)local_1d0);
  std::vector<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>::~vector
            ((vector<pstore::repo::definition,_std::allocator<pstore::repo::definition>_> *)
             &compilation.size);
  pstore::transaction<std::unique_lock<mock_mutex>_>::~transaction
            ((transaction<std::unique_lock<mock_mutex>_> *)local_1d0);
  imported_names.lookup_._M_h._M_single_bucket = (__node_base_ptr)0x9abcdef0;
  pstore::exchange::import_ns::string_mapping::string_mapping((string_mapping *)local_2f8);
  std::unique_lock<mock_mutex>::unique_lock
            ((unique_lock<mock_mutex> *)&name_parser.coordinate_,
             (mutex_type *)&transaction_1.lock_.field_0xf);
  ::begin((transaction<std::unique_lock<mock_mutex>_> *)local_338,
          &(this->super_ExchangeCompilation).import_db_,
          (unique_lock<mock_mutex> *)&name_parser.coordinate_);
  std::unique_lock<mock_mutex>::~unique_lock((unique_lock<mock_mutex> *)&name_parser.coordinate_);
  anon_unknown.dwarf_944bc::import_strings_parser
            ((parser<pstore::exchange::import_ns::callbacks> *)&gtest_ar_.message_,
             (transaction *)local_338,(string_mapping *)local_2f8);
  psVar5 = pstore::exchange::export_ns::ostringstream::str_abi_cxx11_((ostringstream *)local_110);
  ppVar6 = pstore::json::parser<pstore::exchange::import_ns::callbacks>::input
                     ((parser<pstore::exchange::import_ns::callbacks> *)&gtest_ar_.message_,psVar5);
  pstore::json::parser<pstore::exchange::import_ns::callbacks>::eof(ppVar6);
  local_401 = pstore::json::parser<pstore::exchange::import_ns::callbacks>::has_error
                        ((parser<pstore::exchange::import_ns::callbacks> *)&gtest_ar_.message_);
  local_401 = !local_401;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_400,&local_401,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_400);
  if (!bVar2) {
    testing::Message::Message(&local_410);
    pMVar7 = testing::Message::operator<<(&local_410,(char (*) [17])"JSON error was: ");
    peVar8 = pstore::json::parser<pstore::exchange::import_ns::callbacks>::last_error
                       ((parser<pstore::exchange::import_ns::callbacks> *)&gtest_ar_.message_);
    std::error_code::message_abi_cxx11_(&local_430,peVar8);
    pMVar7 = testing::Message::operator<<(pMVar7,&local_430);
    local_431 = ' ';
    pMVar7 = testing::Message::operator<<(pMVar7,&local_431);
    local_43c = pstore::json::parser<pstore::exchange::import_ns::callbacks>::coordinate
                          ((parser<pstore::exchange::import_ns::callbacks> *)&gtest_ar_.message_);
    pMVar7 = testing::Message::operator<<(pMVar7,&local_43c);
    local_43d = '\n';
    pMVar7 = testing::Message::operator<<(pMVar7,&local_43d);
    psVar5 = pstore::exchange::export_ns::ostringstream::str_abi_cxx11_((ostringstream *)local_110);
    pMVar7 = testing::Message::operator<<(pMVar7,psVar5);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_468,(internal *)local_400,(AssertionResult *)"name_parser.has_error ()","true"
               ,"false",pcVar9);
    message = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_448,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_compilation.cpp"
               ,0xad,message);
    testing::internal::AssertHelper::operator=(&local_448,pMVar7);
    testing::internal::AssertHelper::~AssertHelper(&local_448);
    std::__cxx11::string::~string((string *)&local_468);
    std::__cxx11::string::~string((string *)&local_430);
    testing::Message::~Message(&local_410);
  }
  bVar2 = !bVar2;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_400);
  if (!bVar2) {
    pstore::index::
    get_index<(pstore::trailer::indices)2,pstore::database,pstore::index::hamt_map<pstore::uint128,pstore::extent<pstore::repo::fragment>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>>
              ((index *)&compilation_parser.coordinate_,
               &(this->super_ExchangeCompilation).import_db_,true);
    anon_unknown.dwarf_944bc::import_compilation_parser
              ((parser<pstore::exchange::import_ns::callbacks> *)&gtest_ar__1.message_,
               (transaction *)local_338,(string_mapping *)local_2f8,
               (shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>_>
                *)&compilation_parser.coordinate_,
               (digest *)&imported_names.lookup_._M_h._M_single_bucket);
    psVar5 = pstore::exchange::export_ns::ostringstream::str_abi_cxx11_((ostringstream *)local_190);
    ppVar6 = pstore::json::parser<pstore::exchange::import_ns::callbacks>::input
                       ((parser<pstore::exchange::import_ns::callbacks> *)&gtest_ar__1.message_,
                        psVar5);
    pstore::json::parser<pstore::exchange::import_ns::callbacks>::eof(ppVar6);
    local_539 = pstore::json::parser<pstore::exchange::import_ns::callbacks>::has_error
                          ((parser<pstore::exchange::import_ns::callbacks> *)&gtest_ar__1.message_);
    local_539 = !local_539;
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_538,&local_539,(type *)0x0);
    bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_538);
    if (!bVar2) {
      testing::Message::Message(&local_548);
      pMVar7 = testing::Message::operator<<(&local_548,(char (*) [17])"JSON error was: ");
      peVar8 = pstore::json::parser<pstore::exchange::import_ns::callbacks>::last_error
                         ((parser<pstore::exchange::import_ns::callbacks> *)&gtest_ar__1.message_);
      std::error_code::message_abi_cxx11_(&local_568,peVar8);
      pMVar7 = testing::Message::operator<<(pMVar7,&local_568);
      local_569 = ' ';
      pMVar7 = testing::Message::operator<<(pMVar7,&local_569);
      local_574 = pstore::json::parser<pstore::exchange::import_ns::callbacks>::coordinate
                            ((parser<pstore::exchange::import_ns::callbacks> *)&gtest_ar__1.message_
                            );
      pMVar7 = testing::Message::operator<<(pMVar7,&local_574);
      local_575 = '\n';
      pMVar7 = testing::Message::operator<<(pMVar7,&local_575);
      psVar5 = pstore::exchange::export_ns::ostringstream::str_abi_cxx11_
                         ((ostringstream *)local_190);
      pMVar7 = testing::Message::operator<<(pMVar7,psVar5);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)
                 &compilation_index.
                  super___shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount,(internal *)local_538,
                 (AssertionResult *)"compilation_parser.has_error ()","true","false",pcVar9);
      pcVar9 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_580,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_compilation.cpp"
                 ,0xb7,pcVar9);
      testing::internal::AssertHelper::operator=(&local_580,pMVar7);
      testing::internal::AssertHelper::~AssertHelper(&local_580);
      std::__cxx11::string::~string
                ((string *)
                 &compilation_index.
                  super___shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount);
      std::__cxx11::string::~string((string *)&local_568);
      testing::Message::~Message(&local_548);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_538);
    bVar1 = bVar2;
    if (bVar1) {
      pstore::transaction_base::commit((transaction_base *)local_338);
    }
    bVar2 = !bVar1 && !bVar2;
    pstore::json::parser<pstore::exchange::import_ns::callbacks>::~parser
              ((parser<pstore::exchange::import_ns::callbacks> *)&gtest_ar__1.message_);
    std::
    shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>_>
    ::~shared_ptr((shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>_>
                   *)&compilation_parser.coordinate_);
  }
  pstore::json::parser<pstore::exchange::import_ns::callbacks>::~parser
            ((parser<pstore::exchange::import_ns::callbacks> *)&gtest_ar_.message_);
  pstore::transaction<std::unique_lock<mock_mutex>_>::~transaction
            ((transaction<std::unique_lock<mock_mutex>_> *)local_338);
  if (!bVar2) {
    pstore::index::
    get_index<(pstore::trailer::indices)0,pstore::database,pstore::index::hamt_map<pstore::uint128,pstore::extent<pstore::repo::compilation>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>>
              ((index *)&pos.pos_,&(this->super_ExchangeCompilation).import_db_,true);
    peVar10 = std::
              __shared_ptr_access<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)&pos.pos_);
    pstore::index::
    hamt_map<pstore::uint128,pstore::extent<pstore::repo::compilation>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>
    ::find<pstore::uint128,void>
              ((const_iterator *)&gtest_ar.message_,
               (hamt_map<pstore::uint128,pstore::extent<pstore::repo::compilation>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>
                *)peVar10,&(this->super_ExchangeCompilation).import_db_,
               (uint128 *)&imported_names.lookup_._M_h._M_single_bucket);
    peVar10 = std::
              __shared_ptr_access<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)&pos.pos_);
    pstore::index::
    hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>
    ::end(&local_7a0,peVar10,&(this->super_ExchangeCompilation).import_db_);
    addr.a_.a_ = (address)&gtest_ar.message_;
    testing::internal::
    CmpHelperNE<pstore::index::hamt_map<pstore::uint128,pstore::extent<pstore::repo::compilation>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>::iterator_base<true>,pstore::index::hamt_map<pstore::uint128,pstore::extent<pstore::repo::compilation>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>::iterator_base<false>>
              ((internal *)local_6b0,"pos","compilation_index->end (import_db_)",
               (iterator_base<true> *)addr.a_.a_,&local_7a0);
    pstore::index::
    hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>
    ::iterator_base<false>::~iterator_base(&local_7a0);
    bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_6b0);
    if (!bVar2) {
      testing::Message::Message(&local_7a8);
      pMVar7 = testing::Message::operator<<
                         (&local_7a8,
                          (char (*) [52])"Compilation was not found in the index after import");
      pcVar9 = testing::AssertionResult::failure_message((AssertionResult *)local_6b0);
      addr.a_.a_ = (address)0xc3;
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)
                 &imported_compilation.
                  super___shared_ptr<const_pstore::repo::compilation,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_compilation.cpp"
                 ,0xc3,pcVar9);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)
                 &imported_compilation.
                  super___shared_ptr<const_pstore::repo::compilation,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount,pMVar7);
      testing::internal::AssertHelper::~AssertHelper
                ((AssertHelper *)
                 &imported_compilation.
                  super___shared_ptr<const_pstore::repo::compilation,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      testing::Message::~Message(&local_7a8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_6b0);
    if (bVar2) {
      pstore::index::
      hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>
      ::iterator_base<true>::operator->((iterator_base<true> *)&gtest_ar.message_);
      pstore::database::getro<pstore::repo::compilation,void>
                ((database *)&gtest_ar_1.message_,
                 (extent<pstore::repo::compilation> *)&(this->super_ExchangeCompilation).import_db_)
      ;
      peVar4 = std::
               __shared_ptr_access<const_pstore::repo::compilation,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<const_pstore::repo::compilation,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&gtest_ar_1.message_);
      local_7f8.a_ = (value_type)pstore::repo::compilation::triple(peVar4);
      (anonymous_namespace)::load_string_abi_cxx11_
                (&local_7f0,(_anonymous_namespace_ *)&(this->super_ExchangeCompilation).import_db_,
                 (database *)local_7f8.a_,addr);
      testing::internal::EqHelper::
      Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*,_nullptr>
                ((EqHelper *)local_7d0,"load_string (import_db_, imported_compilation->triple ())",
                 "triple",&local_7f0,names._M_elems);
      std::__cxx11::string::~string((string *)&local_7f0);
      bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_7d0);
      if (!bVar2) {
        testing::Message::Message(&local_800);
        pcVar9 = testing::AssertionResult::failure_message((AssertionResult *)local_7d0);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_compilation.cpp"
                   ,0xc6,pcVar9);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_800);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
        testing::Message::~Message(&local_800);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_7d0);
      peVar4 = std::
               __shared_ptr_access<const_pstore::repo::compilation,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<const_pstore::repo::compilation,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&gtest_ar_1.message_);
      local_81c = pstore::repo::compilation::size(peVar4);
      local_820 = 0;
      testing::internal::EqHelper::Compare<unsigned_int,_unsigned_int,_nullptr>
                ((EqHelper *)local_818,"imported_compilation->size ()","0U",&local_81c,&local_820);
      bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_818);
      if (!bVar2) {
        testing::Message::Message(&local_828);
        pMVar7 = testing::Message::operator<<
                           (&local_828,
                            (char (*) [46])"The compilation should contain no definitions");
        pcVar9 = testing::AssertionResult::failure_message((AssertionResult *)local_818);
        testing::internal::AssertHelper::AssertHelper
                  (&local_830,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_compilation.cpp"
                   ,199,pcVar9);
        testing::internal::AssertHelper::operator=(&local_830,pMVar7);
        testing::internal::AssertHelper::~AssertHelper(&local_830);
        testing::Message::~Message(&local_828);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_818);
      std::shared_ptr<const_pstore::repo::compilation>::~shared_ptr
                ((shared_ptr<const_pstore::repo::compilation> *)&gtest_ar_1.message_);
    }
    pstore::index::
    hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>
    ::iterator_base<true>::~iterator_base((iterator_base<true> *)&gtest_ar.message_);
    std::
    shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>_>
    ::~shared_ptr((shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>_>
                   *)&pos.pos_);
  }
  pstore::exchange::import_ns::string_mapping::~string_mapping((string_mapping *)local_2f8);
  pstore::exchange::export_ns::ostringstream::~ostringstream((ostringstream *)local_190);
  pstore::exchange::export_ns::ostringstream::~ostringstream((ostringstream *)local_110);
  pstore::exchange::export_ns::string_mapping::~string_mapping((string_mapping *)local_b8);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::typed_address<pstore::indirect_string>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::typed_address<pstore::indirect_string>_>_>_>
  ::~unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::typed_address<pstore::indirect_string>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::typed_address<pstore::indirect_string>_>_>_>
                    *)local_58);
  return;
}

Assistant:

TEST_F (ExchangeCompilation, Empty) {
    using namespace pstore::exchange;
    static constexpr auto comments = false;
    static constexpr auto name_index = pstore::trailer::indices::name;

    constexpr auto * triple = "triple";
    std::array<pstore::gsl::czstring, 1> names{{triple}};
    std::unordered_map<std::string, pstore::typed_address<pstore::indirect_string>> indir_strings;
    add_export_strings<name_index> (export_db_, std::begin (names), std::end (names),
                                    std::inserter (indir_strings, std::end (indir_strings)));

    // Write the names that we just created as JSON.
    export_ns::string_mapping exported_names{export_db_, export_ns::name_index_tag ()};
    export_ns::ostringstream exported_names_stream;
    export_ns::emit_strings<name_index> (exported_names_stream, export_ns::indent{}, export_db_,
                                         export_db_.get_current_revision (), "", &exported_names,
                                         comments);

    export_ns::ostringstream exported_compilation_stream;
    {
        mock_mutex mutex;
        auto transaction = begin (export_db_, transaction_lock{mutex});
        std::vector<pstore::repo::definition> definitions;
        pstore::extent<pstore::repo::compilation> const compilation =
            pstore::repo::compilation::alloc (transaction, indir_strings[triple],
                                              std::begin (definitions), std::end (definitions));

        emit_compilation (exported_compilation_stream, export_ns::indent{}, export_db_,
                          *export_db_.getro (compilation), exported_names, comments);
        transaction.commit ();
    }



    constexpr pstore::index::digest compilation_digest{0x12345678, 0x9ABCDEF0};
    import_ns::string_mapping imported_names;
    {
        mock_mutex mutex;
        auto transaction = begin (import_db_, transaction_lock{mutex});
        auto name_parser = import_strings_parser (&transaction, &imported_names);
        name_parser.input (exported_names_stream.str ()).eof ();
        ASSERT_FALSE (name_parser.has_error ())
            << "JSON error was: " << name_parser.last_error ().message () << ' '
            << name_parser.coordinate () << '\n'
            << exported_names_stream.str ();

        auto const fragment_index =
            pstore::index::get_index<pstore::trailer::indices::fragment> (import_db_);
        auto compilation_parser = import_compilation_parser (&transaction, &imported_names,
                                                             fragment_index, compilation_digest);
        compilation_parser.input (exported_compilation_stream.str ()).eof ();
        ASSERT_FALSE (compilation_parser.has_error ())
            << "JSON error was: " << compilation_parser.last_error ().message () << ' '
            << compilation_parser.coordinate () << '\n'
            << exported_compilation_stream.str ();

        transaction.commit ();
    }


    auto const compilation_index =
        pstore::index::get_index<pstore::trailer::indices::compilation> (import_db_);
    auto const pos = compilation_index->find (import_db_, compilation_digest);
    ASSERT_NE (pos, compilation_index->end (import_db_))
        << "Compilation was not found in the index after import";
    auto const imported_compilation = import_db_.getro (pos->second);
    EXPECT_EQ (load_string (import_db_, imported_compilation->triple ()), triple);
    ASSERT_EQ (imported_compilation->size (), 0U)
        << "The compilation should contain no definitions";
}